

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCustomAttributes.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::Glorp>::writeValueTo
          (TypedAttribute<Imf_3_4::Glorp> *this,OStream *os,int version)

{
  OStream *in_RDI;
  int in_stack_ffffffffffffffdc;
  
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void
GlorpAttribute::writeValueTo (OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.a);
    Xdr::write<StreamIO> (os, _value.b);
}